

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

void __thiscall llvm::cl::extrahelp::extrahelp(extrahelp *this,StringRef Help)

{
  CommandLineParser *pCVar1;
  extrahelp *this_local;
  StringRef Help_local;
  
  Help_local.Data = (char *)Help.Length;
  this_local = (extrahelp *)Help.Data;
  (this->morehelp).Data = (char *)this_local;
  (this->morehelp).Length = (size_t)Help_local.Data;
  pCVar1 = ManagedStatic<(anonymous_namespace)::CommandLineParser,_llvm::object_creator<(anonymous_namespace)::CommandLineParser>,_llvm::object_deleter<(anonymous_namespace)::CommandLineParser>_>
           ::operator->(&GlobalParser);
  std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back
            (&pCVar1->MoreHelp,(value_type *)&this_local);
  return;
}

Assistant:

extrahelp::extrahelp(StringRef Help) : morehelp(Help) {
  GlobalParser->MoreHelp.push_back(Help);
}